

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trompeloeil.hpp
# Opt level: O2

void __thiscall
trompeloeil::list_elem<trompeloeil::condition_base<void_()>_>::~list_elem
          (list_elem<trompeloeil::condition_base<void_()>_> *this)

{
  ~list_elem(this);
  operator_delete(this);
  return;
}

Assistant:

virtual
    ~list_elem()
    {
      unlink();
    }